

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::memcasecmp(char *s1,char *s2,size_t len)

{
  byte bVar1;
  byte bVar2;
  ulong uStack_40;
  int diff;
  size_t i;
  uchar *us2;
  uchar *us1;
  size_t len_local;
  char *s2_local;
  char *s1_local;
  
  uStack_40 = 0;
  while( true ) {
    if (len <= uStack_40) {
      return 0;
    }
    bVar1 = ascii_tolower(s1[uStack_40]);
    bVar2 = ascii_tolower(s2[uStack_40]);
    if ((uint)bVar1 - (uint)bVar2 != 0) break;
    uStack_40 = uStack_40 + 1;
  }
  return (uint)bVar1 - (uint)bVar2;
}

Assistant:

static int memcasecmp(const char *s1, const char *s2, size_t len) {
  const unsigned char *us1 = reinterpret_cast<const unsigned char *>(s1);
  const unsigned char *us2 = reinterpret_cast<const unsigned char *>(s2);

  for (size_t i = 0; i < len; i++) {
    const int diff =
      static_cast<int>(static_cast<unsigned char>(ascii_tolower(us1[i]))) -
      static_cast<int>(static_cast<unsigned char>(ascii_tolower(us2[i])));
    if (diff != 0) return diff;
  }
  return 0;
}